

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall
wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitTry
          (BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this,Try *curr)

{
  BinaryInstWriter *this_00;
  ulong uVar1;
  uint i;
  Expression **ppEVar2;
  
  this_00 = (BinaryInstWriter *)(this + 2);
  BinaryInstWriter::visit(this_00,(Expression *)curr);
  visitPossibleBlockContents(this,curr->body);
  i = 0;
  while( true ) {
    uVar1 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
            usedElements;
    if (uVar1 <= i) break;
    BinaryInstWriter::emitCatch(this_00,curr,i);
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)i);
    visitPossibleBlockContents(this,*ppEVar2);
    i = i + 1;
  }
  if ((curr->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements - uVar1 == 1) {
    BinaryInstWriter::emitCatchAll(this_00,curr);
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    visitPossibleBlockContents(this,*ppEVar2);
  }
  if ((curr->delegateTarget).super_IString.str._M_str == (char *)0x0) {
    BinaryInstWriter::emitScopeEnd(this_00,(Expression *)curr);
  }
  else {
    BinaryInstWriter::emitDelegate(this_00,curr);
  }
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id == 1) {
    BinaryInstWriter::emitUnreachable(this_00);
    return;
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitTry(Try* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    emitCatch(curr, i);
    visitPossibleBlockContents(curr->catchBodies[i]);
  }
  if (curr->hasCatchAll()) {
    emitCatchAll(curr);
    visitPossibleBlockContents(curr->catchBodies.back());
  }
  if (curr->isDelegate()) {
    emitDelegate(curr);
    // Note that when we emit a delegate we do not need to also emit a scope
    // ending, as the delegate ends the scope.
  } else {
    emitScopeEnd(curr);
  }
  if (curr->type == Type::unreachable) {
    emitUnreachable();
  }
}